

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O0

void __thiscall TCLAP::CmdLine::xorAdd(CmdLine *this,Arg *a,Arg *b)

{
  vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *in_RDX;
  vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *in_RDI;
  vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> ors;
  value_type *in_stack_ffffffffffffff98;
  undefined1 local_30 [24];
  vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *local_18;
  
  local_18 = in_RDX;
  std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::vector
            ((vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)0x12fccc);
  std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::push_back
            (in_RDI,in_stack_ffffffffffffff98);
  std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::push_back
            (in_RDI,in_stack_ffffffffffffff98);
  (*(code *)(in_RDI->super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>)._M_impl.
            super__Vector_impl_data._M_start[5])(in_RDI,local_30);
  std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::~vector(local_18);
  return;
}

Assistant:

inline void CmdLine::xorAdd( Arg& a, Arg& b )
{
	std::vector<Arg*> ors;
	ors.push_back( &a );
	ors.push_back( &b );
	xorAdd( ors );
}